

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_op_store_QT0_fpr(TCGContext_conflict8 *tcg_ctx,uint dst)

{
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_ld_i64,
                      (TCGArg)((long)&tcg_ctx->pool_cur + (long)tcg_ctx->cpu_fpr[dst >> 1]),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x1b20);
  tcg_gen_op3_sparc64(tcg_ctx,INDEX_op_ld_i64,
                      (TCGArg)((long)&tcg_ctx->pool_cur +
                              (long)tcg_ctx->cpu_fpr[(ulong)(dst >> 1) + 1]),
                      (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),0x1b18);
  return;
}

Assistant:

static void gen_op_store_QT0_fpr(TCGContext *tcg_ctx, unsigned int dst)
{
    tcg_gen_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst / 2], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt0) +
                   offsetof(CPU_QuadU, ll.upper));
    tcg_gen_ld_i64(tcg_ctx, tcg_ctx->cpu_fpr[dst/2 + 1], tcg_ctx->cpu_env, offsetof(CPUSPARCState, qt0) +
                   offsetof(CPU_QuadU, ll.lower));
}